

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int porterNext(sqlite3_tokenizer_cursor *pCursor,char **pzToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  uint uVar1;
  char cVar2;
  sqlite3_tokenizer *zOut;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  byte *pbVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  byte bVar13;
  sqlite3_tokenizer *psVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  byte *z;
  char zReverse [28];
  byte *local_a0;
  sqlite3_tokenizer *local_98;
  int *local_90;
  sqlite3_tokenizer_cursor *local_88;
  sqlite3_tokenizer *local_80;
  char **local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  byte abStack_58 [22];
  byte local_42 [18];
  
  iVar15 = *(int *)((long)&pCursor[2].pTokenizer + 4);
  iVar8 = *(int *)&pCursor[2].pTokenizer;
  if (iVar8 <= iVar15) {
    return 0x65;
  }
  psVar14 = pCursor[1].pTokenizer;
  local_98 = psVar14;
  local_90 = pnBytes;
  local_88 = pCursor;
  local_78 = pzToken;
  local_70 = piStartOffset;
  local_68 = piEndOffset;
  local_60 = piPosition;
LAB_001b74f8:
  lVar9 = (long)iVar15;
  cVar2 = *(char *)((long)&psVar14->pModule + lVar9);
  if (-1 < cVar2) {
    iVar16 = iVar15;
    do {
      if (('/' < cVar2) &&
         (iVar15 = iVar16, "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)cVar2 - 0x30] != '\0'))
      break;
      iVar15 = iVar16 + 1;
      *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar15;
      if (iVar8 + -1 == iVar16) goto LAB_001b7e39;
      cVar2 = *(char *)((long)&psVar14->pModule + lVar9 + 1);
      lVar9 = lVar9 + 1;
      iVar16 = iVar15;
    } while (-1 < cVar2);
  }
  iVar16 = iVar15;
  if (iVar15 < iVar8) {
    pcVar4 = (char *)((long)&psVar14->pModule + (long)iVar15);
    do {
      cVar2 = *pcVar4;
      if ((-1 < cVar2) &&
         ((iVar16 = iVar15, cVar2 < '0' ||
          ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)cVar2 - 0x30] == '\0')))) break;
      iVar15 = iVar15 + 1;
      *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar15;
      pcVar4 = pcVar4 + 1;
      iVar16 = iVar8;
    } while (iVar8 != iVar15);
  }
  iVar8 = (int)lVar9;
  uVar17 = iVar16 - iVar8;
  if (uVar17 != 0 && iVar8 <= iVar16) {
    zOut = pCursor[4].pTokenizer;
    if (*(int *)&pCursor[5].pTokenizer < (int)uVar17) {
      uVar1 = uVar17 + 0x14;
      *(uint *)&pCursor[5].pTokenizer = uVar1;
      iVar15 = sqlite3_initialize();
      if (iVar15 != 0) {
        return 7;
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      zOut = (sqlite3_tokenizer *)sqlite3Realloc(zOut,(ulong)uVar1);
      if (zOut == (sqlite3_tokenizer *)0x0) {
        return 7;
      }
      local_88[4].pTokenizer = zOut;
      psVar14 = local_98;
    }
    pcVar4 = (char *)((long)&psVar14->pModule + (long)iVar8);
    if (0xffffffed < uVar17 - 0x15) {
      pbVar11 = local_42;
      lVar9 = 0x1700000000;
      uVar5 = 0;
      do {
        bVar13 = pcVar4[uVar5];
        if ((byte)(bVar13 + 0xbf) < 0x1a) {
          bVar13 = bVar13 | 0x20;
        }
        else if (0x19 < (byte)(bVar13 + 0x9f)) goto LAB_001b75e8;
        *pbVar11 = bVar13;
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + -0x100000000;
        pbVar11 = pbVar11 + -1;
      } while (uVar17 != uVar5);
      lVar9 = lVar9 >> 0x20;
      local_42[5] = 0;
      local_42[1] = 0;
      local_42[2] = 0;
      local_42[3] = 0;
      local_42[4] = 0;
      local_a0 = abStack_58 + lVar9;
      if (*local_a0 == 0x73) {
        bVar13 = 0x73;
        lVar12 = 0;
        do {
          if (bVar13 != abStack_58[lVar12 + (0x17 - (int)uVar5)]) {
            bVar13 = 0x73;
            lVar12 = 0;
            goto LAB_001b76d4;
          }
          bVar13 = "sess"[lVar12 + 1];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        (abStack_58 + lVar9 + 2)[0] = 0x73;
        (abStack_58 + lVar9 + 2)[1] = 0x73;
        local_a0 = abStack_58 + lVar9 + 2;
      }
      goto LAB_001b770b;
    }
LAB_001b75e8:
    copy_stemmer(pcVar4,uVar17,(char *)zOut,local_90);
    goto LAB_001b7df4;
  }
  goto LAB_001b7e39;
  while( true ) {
    bVar13 = "sei"[lVar12 + 1];
    lVar12 = lVar12 + 1;
    if (lVar12 == 3) break;
LAB_001b76d4:
    if (bVar13 != abStack_58[lVar12 + (0x17 - (int)uVar5)]) {
      if (abStack_58[lVar9 + 1] == 0x73) {
        local_a0[0] = 0x73;
        local_a0[1] = 0x73;
        goto LAB_001b770b;
      }
      local_a0 = abStack_58 + 1;
      goto LAB_001b7706;
    }
  }
  abStack_58[lVar9 + 2] = 0x69;
  local_a0 = abStack_58 + 2;
LAB_001b7706:
  local_a0 = local_a0 + lVar9;
LAB_001b770b:
  pbVar11 = local_a0;
  local_80 = zOut;
  iVar15 = stem((char **)&local_a0,"dee","ee",m_gt_0);
  pbVar6 = local_a0;
  psVar14 = local_98;
  if (iVar15 == 0) {
    pbVar10 = local_a0 + 3;
    bVar13 = 0x67;
    lVar9 = 0;
LAB_001b77d5:
    if (bVar13 == local_a0[lVar9]) goto code_r0x001b77db;
    bVar13 = *local_a0;
    if (bVar13 != 100) goto LAB_001b773f;
    if (local_a0[1] == 0x65) {
      pbVar10 = local_a0 + 2;
      z = pbVar10;
      do {
        iVar15 = isConsonant((char *)z);
        z = z + 1;
      } while (iVar15 != 0);
      goto LAB_001b7828;
    }
  }
LAB_001b773c:
  bVar13 = *pbVar6;
LAB_001b773f:
  pbVar11 = pbVar6;
  if (bVar13 == 0x79) {
    do {
      pbVar11 = pbVar11 + 1;
      iVar15 = isConsonant((char *)pbVar11);
    } while (iVar15 != 0);
    if (*pbVar11 != 0) {
      *pbVar6 = 0x69;
      pbVar6 = local_a0;
    }
  }
  switch(pbVar6[1]) {
  case 0x61:
    iVar15 = stem((char **)&local_a0,"lanoita","ate",m_gt_0);
    if (iVar15 == 0) {
      pcVar7 = "lanoit";
      pcVar4 = "tion";
      goto LAB_001b7a31;
    }
    break;
  case 99:
    iVar15 = stem((char **)&local_a0,"icne","ence",m_gt_0);
    if (iVar15 == 0) {
      pcVar7 = "icna";
      pcVar4 = "ance";
      goto LAB_001b7a31;
    }
    break;
  case 0x65:
    pcVar7 = "rezi";
    pcVar4 = "ize";
    goto LAB_001b7a31;
  case 0x67:
    pcVar7 = "igol";
    pcVar4 = "log";
LAB_001b7a31:
    stem((char **)&local_a0,pcVar7,pcVar4,m_gt_0);
    break;
  case 0x6c:
    iVar15 = stem((char **)&local_a0,"ilb","ble",m_gt_0);
    if (((iVar15 == 0) && (iVar15 = stem((char **)&local_a0,"illa","al",m_gt_0), iVar15 == 0)) &&
       ((iVar15 = stem((char **)&local_a0,"iltne","ent",m_gt_0), iVar15 == 0 &&
        (iVar15 = stem((char **)&local_a0,"ile","e",m_gt_0), iVar15 == 0)))) {
      pcVar7 = "ilsuo";
LAB_001b7c09:
      pcVar4 = "ous";
      goto LAB_001b7a31;
    }
    break;
  case 0x6f:
    iVar15 = stem((char **)&local_a0,"noitazi","ize",m_gt_0);
    if ((iVar15 == 0) && (iVar15 = stem((char **)&local_a0,"noita","ate",m_gt_0), iVar15 == 0)) {
      pcVar7 = "rota";
      pcVar4 = "ate";
      goto LAB_001b7a31;
    }
    break;
  case 0x73:
    iVar15 = stem((char **)&local_a0,"msila","al",m_gt_0);
    if (((iVar15 == 0) && (iVar15 = stem((char **)&local_a0,"ssenevi","ive",m_gt_0), iVar15 == 0))
       && (iVar15 = stem((char **)&local_a0,"ssenluf","ful",m_gt_0), iVar15 == 0)) {
      pcVar7 = "ssensuo";
      goto LAB_001b7c09;
    }
    break;
  case 0x74:
    iVar15 = stem((char **)&local_a0,"itila","al",m_gt_0);
    if ((iVar15 == 0) && (iVar15 = stem((char **)&local_a0,"itivi","ive",m_gt_0), iVar15 == 0)) {
      pcVar7 = "itilib";
      pcVar4 = "ble";
      goto LAB_001b7a31;
    }
  }
  bVar13 = *local_a0;
  if (bVar13 < 0x6c) {
    if (bVar13 == 0x65) {
      iVar15 = stem((char **)&local_a0,"etaci","ic",m_gt_0);
      if ((iVar15 == 0) && (iVar15 = stem((char **)&local_a0,"evita","",m_gt_0), iVar15 == 0)) {
        pcVar4 = "ezila";
        pcVar7 = "al";
        goto LAB_001b7b20;
      }
    }
    else if (bVar13 == 0x69) {
      pcVar4 = "itici";
      pcVar7 = "ic";
LAB_001b7b20:
      stem((char **)&local_a0,pcVar4,pcVar7,m_gt_0);
    }
  }
  else if (bVar13 == 0x6c) {
    iVar15 = stem((char **)&local_a0,"laci","ic",m_gt_0);
    if (iVar15 == 0) {
      pcVar4 = "luf";
      goto LAB_001b7b19;
    }
  }
  else if (bVar13 == 0x73) {
    pcVar4 = "ssen";
LAB_001b7b19:
    pcVar7 = "";
    goto LAB_001b7b20;
  }
  switch(local_a0[1]) {
  case 0x61:
    if (*local_a0 != 0x6c) goto switchD_001b7b50_caseD_62;
    break;
  default:
    goto switchD_001b7b50_caseD_62;
  case 99:
    if (((*local_a0 != 0x65) || (local_a0[2] != 0x6e)) || ((local_a0[3] | 4) != 0x65))
    goto switchD_001b7b50_caseD_62;
    goto LAB_001b7cef;
  case 0x65:
    if (*local_a0 != 0x72) goto switchD_001b7b50_caseD_62;
    break;
  case 0x69:
    if (*local_a0 != 99) goto switchD_001b7b50_caseD_62;
    break;
  case 0x6c:
    if (((*local_a0 != 0x65) || (local_a0[2] != 0x62)) || ((local_a0[3] | 8) != 0x69))
    goto switchD_001b7b50_caseD_62;
LAB_001b7cef:
    pbVar11 = local_a0 + 4;
    goto LAB_001b7d06;
  case 0x6e:
    if (*local_a0 != 0x74) goto switchD_001b7b50_caseD_62;
    if (local_a0[2] == 0x65) {
      iVar15 = stem((char **)&local_a0,"tneme","",m_gt_1);
      if ((iVar15 != 0) || (iVar15 = stem((char **)&local_a0,"tnem","",m_gt_1), iVar15 != 0))
      goto switchD_001b7b50_caseD_62;
      pcVar4 = "tne";
      goto LAB_001b7d48;
    }
    if (local_a0[2] != 0x61) goto switchD_001b7b50_caseD_62;
    goto LAB_001b7d02;
  case 0x6f:
    if (*local_a0 != 0x75) {
      if (1 < (byte)(local_a0[3] + 0x8d)) goto switchD_001b7b50_caseD_62;
      pcVar4 = "noi";
      goto LAB_001b7d48;
    }
    break;
  case 0x73:
    if (*local_a0 != 0x6d) goto switchD_001b7b50_caseD_62;
    goto LAB_001b7cb5;
  case 0x74:
    iVar15 = stem((char **)&local_a0,"eta","",m_gt_1);
    if (iVar15 != 0) goto switchD_001b7b50_caseD_62;
    pcVar4 = "iti";
LAB_001b7d48:
    stem((char **)&local_a0,pcVar4,"",m_gt_1);
    goto switchD_001b7b50_caseD_62;
  case 0x75:
    if ((*local_a0 != 0x73) || (local_a0[2] != 0x6f)) goto switchD_001b7b50_caseD_62;
    goto LAB_001b7d02;
  case 0x76:
  case 0x7a:
    if (*local_a0 != 0x65) goto switchD_001b7b50_caseD_62;
LAB_001b7cb5:
    if (local_a0[2] != 0x69) goto switchD_001b7b50_caseD_62;
LAB_001b7d02:
    pbVar11 = local_a0 + 3;
    goto LAB_001b7d06;
  }
  pbVar11 = local_a0 + 2;
LAB_001b7d06:
  iVar15 = m_gt_1((char *)pbVar11);
  if (iVar15 != 0) {
    local_a0 = pbVar11;
  }
switchD_001b7b50_caseD_62:
  pbVar11 = local_a0;
  if (*local_a0 == 0x65) {
    pbVar6 = local_a0 + 1;
    iVar15 = m_gt_1((char *)pbVar6);
    if ((iVar15 != 0) ||
       ((iVar15 = m_eq_1((char *)pbVar6), iVar15 != 0 &&
        (iVar15 = star_oh((char *)pbVar6), iVar15 == 0)))) {
      pbVar11 = pbVar6;
      local_a0 = pbVar6;
    }
  }
  iVar15 = m_gt_1((char *)pbVar11);
  if (((iVar15 != 0) && (*pbVar11 == 0x6c)) && (pbVar11[1] == 0x6c)) {
    pbVar11 = pbVar11 + 1;
    local_a0 = pbVar11;
  }
  sVar3 = strlen((char *)pbVar11);
  iVar15 = (int)sVar3;
  *local_90 = iVar15;
  *(char *)((long)&local_80->pModule + (long)iVar15) = '\0';
  bVar13 = *pbVar11;
  if (bVar13 != 0) {
    pbVar6 = (byte *)((long)&local_80->pModule + (long)iVar15);
    do {
      pbVar6 = pbVar6 + -1;
      pbVar11 = pbVar11 + 1;
      *pbVar6 = bVar13;
      bVar13 = *pbVar11;
    } while (bVar13 != 0);
  }
LAB_001b7df4:
  *local_78 = (char *)local_88[4].pTokenizer;
  *local_70 = iVar8;
  *local_68 = *(int *)((long)&local_88[2].pTokenizer + 4);
  iVar15 = *(int *)&local_88[3].pTokenizer;
  *(int *)&local_88[3].pTokenizer = iVar15 + 1;
  *local_60 = iVar15;
  pCursor = local_88;
  if (iVar8 < iVar16) {
    return 0;
  }
LAB_001b7e39:
  iVar8 = *(int *)&pCursor[2].pTokenizer;
  iVar15 = *(int *)((long)&pCursor[2].pTokenizer + 4);
  if (iVar8 <= iVar15) {
    return 0x65;
  }
  goto LAB_001b74f8;
code_r0x001b77db:
  bVar13 = "gni"[lVar9 + 1];
  lVar9 = lVar9 + 1;
  z = pbVar10;
  if (lVar9 == 3) goto LAB_001b77eb;
  goto LAB_001b77d5;
LAB_001b77eb:
  do {
    iVar15 = isConsonant((char *)z);
    z = z + 1;
  } while (iVar15 != 0);
LAB_001b7828:
  psVar14 = local_98;
  if (z[-1] != 0) {
    pbVar6 = pbVar10;
    local_a0 = pbVar10;
  }
  if (pbVar6 != pbVar11) {
    bVar13 = *pbVar6;
    if (bVar13 == 0x6c) {
      if (pbVar6[1] == 0x62) {
        pbVar6[1] = 0x62;
        pbVar6[-1] = 0x65;
        pbVar6[0] = 0x6c;
        goto LAB_001b7e9b;
      }
    }
    else if (bVar13 == 0x7a) {
      if (pbVar6[1] == 0x69) {
        pbVar6[1] = 0x69;
        pbVar6[-1] = 0x65;
        pbVar6[0] = 0x7a;
        goto LAB_001b7e9b;
      }
    }
    else if ((bVar13 == 0x74) && (pbVar6[1] == 0x61)) {
      pbVar6[1] = 0x61;
      pbVar6[-1] = 0x65;
      pbVar6[0] = 0x74;
LAB_001b7e9b:
      local_a0 = pbVar6 + -1;
      pbVar6 = local_a0;
      goto LAB_001b773c;
    }
    iVar15 = isConsonant((char *)pbVar6);
    if (((iVar15 == 0) || (bVar13 != pbVar6[1])) ||
       ((uVar17 = bVar13 - 0x6c, uVar17 < 0xf && ((0x4081U >> (uVar17 & 0x1f) & 1) != 0)))) {
      iVar15 = m_eq_1((char *)pbVar6);
      if ((iVar15 != 0) && (iVar15 = star_oh((char *)pbVar6), iVar15 != 0)) {
        local_a0 = pbVar6 + -1;
        pbVar6[-1] = 0x65;
        pbVar6 = local_a0;
      }
    }
    else {
      local_a0 = pbVar6 + 1;
      pbVar6 = local_a0;
    }
  }
  goto LAB_001b773c;
}

Assistant:

static int porterNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by porterOpen */
  const char **pzToken,               /* OUT: *pzToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  porter_tokenizer_cursor *c = (porter_tokenizer_cursor *) pCursor;
  const char *z = c->zInput;

  while( c->iOffset<c->nInput ){
    int iStartOffset, ch;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nInput && isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nInput && !isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int n = c->iOffset-iStartOffset;
      if( n>c->nAllocated ){
        char *pNew;
        c->nAllocated = n+20;
        pNew = sqlite3_realloc(c->zToken, c->nAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->zToken = pNew;
      }
      porter_stemmer(&z[iStartOffset], n, c->zToken, pnBytes);
      *pzToken = c->zToken;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;
      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}